

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O0

void __thiscall CoreML::Specification::CeilLayerParams::~CeilLayerParams(CeilLayerParams *this)

{
  CeilLayerParams *this_local;
  
  ~CeilLayerParams(this);
  operator_delete(this,0x18);
  return;
}

Assistant:

CeilLayerParams::~CeilLayerParams() {
  // @@protoc_insertion_point(destructor:CoreML.Specification.CeilLayerParams)
  if (GetArenaForAllocation() != nullptr) return;
  SharedDtor();
  _internal_metadata_.Delete<std::string>();
}